

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O1

void ExchCXX::detail::host_eval_exc_helper_unpolar<ExchCXX::BuiltinEPC17_2>
               (int N,const_host_buffer_type rho,host_buffer_type eps)

{
  double dVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  if (0 < N) {
    uVar2 = 0;
    do {
      dVar1 = rho[uVar2];
      dVar4 = 0.0;
      if (1e-24 < dVar1) {
        dVar4 = dVar1 * dVar1;
        if (dVar4 < 0.0) {
          dVar3 = sqrt(dVar4);
        }
        else {
          dVar3 = SQRT(dVar4);
        }
        dVar4 = (double)(~-(ulong)(dVar1 * 0.5 <= 1e-24) &
                        (ulong)((-1.0 / ((2.35 - dVar3 * 2.4 * 0.5) + dVar4 * 6.6 * 0.25)) * dVar1 *
                               0.25));
      }
      eps[uVar2] = dVar4;
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
  }
  return;
}

Assistant:

LDA_EXC_GENERATOR( host_eval_exc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    traits::eval_exc_unpolar( rho[i], eps[i] );

  }

}